

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satMem.c
# Opt level: O2

char * Sat_MmFlexEntryFetch(Sat_MmFlex_t *p,int nBytes)

{
  int iVar1;
  char **ppcVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar3 = p->pCurrent;
  if ((pcVar3 == (char *)0x0) || (pcVar4 = p->pEnd, pcVar4 < pcVar3 + nBytes)) {
    iVar1 = p->nChunks;
    if (iVar1 == p->nChunksAlloc) {
      p->nChunksAlloc = iVar1 * 2;
      if (p->pChunks == (char **)0x0) {
        ppcVar2 = (char **)malloc((long)iVar1 << 4);
      }
      else {
        ppcVar2 = (char **)realloc(p->pChunks,(long)iVar1 << 4);
      }
      p->pChunks = ppcVar2;
    }
    iVar1 = p->nChunkSize;
    if (iVar1 < nBytes) {
      iVar1 = nBytes * 2;
      p->nChunkSize = iVar1;
    }
    pcVar3 = (char *)malloc((long)iVar1);
    p->pCurrent = pcVar3;
    p->pEnd = pcVar3 + iVar1;
    p->nMemoryAlloc = p->nMemoryAlloc + iVar1;
    iVar1 = p->nChunks;
    p->nChunks = iVar1 + 1;
    p->pChunks[iVar1] = pcVar3;
    pcVar3 = p->pCurrent;
    pcVar4 = p->pEnd;
  }
  if (pcVar3 + nBytes <= pcVar4) {
    p->nEntriesUsed = p->nEntriesUsed + 1;
    p->nMemoryUsed = p->nMemoryUsed + nBytes;
    p->pCurrent = pcVar3 + nBytes;
    return pcVar3;
  }
  __assert_fail("p->pCurrent + nBytes <= p->pEnd",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satMem.c"
                ,0x17f,"char *Sat_MmFlexEntryFetch(Sat_MmFlex_t *, int)");
}

Assistant:

char * Sat_MmFlexEntryFetch( Sat_MmFlex_t * p, int nBytes )
{
    char * pTemp;
    // check if there are still free entries
    if ( p->pCurrent == NULL || p->pCurrent + nBytes > p->pEnd )
    { // need to allocate more entries
        if ( p->nChunks == p->nChunksAlloc )
        {
            p->nChunksAlloc *= 2;
            p->pChunks = ABC_REALLOC( char *, p->pChunks, p->nChunksAlloc ); 
        }
        if ( nBytes > p->nChunkSize )
        {
            // resize the chunk size if more memory is requested than it can give
            // (ideally, this should never happen)
            p->nChunkSize = 2 * nBytes;
        }
        p->pCurrent = ABC_ALLOC( char, p->nChunkSize );
        p->pEnd     = p->pCurrent + p->nChunkSize;
        p->nMemoryAlloc += p->nChunkSize;
        // add the chunk to the chunk storage
        p->pChunks[ p->nChunks++ ] = p->pCurrent;
    }
    assert( p->pCurrent + nBytes <= p->pEnd );
    // increment the counter of used entries
    p->nEntriesUsed++;
    // keep track of the memory used
    p->nMemoryUsed += nBytes;
    // return the next entry
    pTemp = p->pCurrent;
    p->pCurrent += nBytes;
    return pTemp;
}